

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpu.cpp
# Opt level: O0

void __thiscall Chip8::CPU::dump(CPU *this)

{
  _Setfill<char> _Var1;
  _Setw _Var2;
  ostream *poVar3;
  undefined8 uVar4;
  int local_14;
  int i;
  CPU *this_local;
  
  poVar3 = std::operator<<((ostream *)&std::cout,"-------- CPU Registers --------");
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  for (local_14 = 0; local_14 < 4; local_14 = local_14 + 1) {
    uVar4 = std::ostream::operator<<((ostream *)&std::cout,std::hex);
    _Var1 = std::setfill<char>('0');
    poVar3 = std::operator<<(uVar4,_Var1._M_c);
    _Var2 = std::setw(1);
    poVar3 = std::operator<<(poVar3,_Var2);
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_14);
    poVar3 = std::operator<<(poVar3,": 0x");
    _Var2 = std::setw(2);
    poVar3 = std::operator<<(poVar3,_Var2);
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,(uint)this->_registers[local_14]);
    poVar3 = std::operator<<(poVar3," ");
    _Var2 = std::setw(1);
    poVar3 = std::operator<<(poVar3,_Var2);
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_14 + 4);
    poVar3 = std::operator<<(poVar3,": 0x");
    _Var2 = std::setw(2);
    poVar3 = std::operator<<(poVar3,_Var2);
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,(uint)this->_registers[local_14 + 4]);
    poVar3 = std::operator<<(poVar3," ");
    _Var2 = std::setw(1);
    poVar3 = std::operator<<(poVar3,_Var2);
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_14 + 8);
    poVar3 = std::operator<<(poVar3,": 0x");
    _Var2 = std::setw(2);
    poVar3 = std::operator<<(poVar3,_Var2);
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,(uint)this->_registers[local_14 + 8]);
    poVar3 = std::operator<<(poVar3," ");
    _Var2 = std::setw(1);
    poVar3 = std::operator<<(poVar3,_Var2);
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_14 + 0xc);
    poVar3 = std::operator<<(poVar3,": 0x");
    _Var2 = std::setw(2);
    poVar3 = std::operator<<(poVar3,_Var2);
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,(uint)this->_registers[local_14 + 0xc]);
    poVar3 = std::operator<<(poVar3," ");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  }
  std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
  poVar3 = std::operator<<((ostream *)&std::cout,"pc: 0x");
  _Var2 = std::setw(3);
  poVar3 = std::operator<<(poVar3,_Var2);
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,(uint)this->_program_counter);
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  poVar3 = std::operator<<(poVar3,"ix: 0x");
  _Var2 = std::setw(3);
  poVar3 = std::operator<<(poVar3,_Var2);
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,(uint)this->_index_register);
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  poVar3 = std::operator<<(poVar3,"sp: 0x");
  _Var2 = std::setw(3);
  poVar3 = std::operator<<(poVar3,_Var2);
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,(uint)this->_stack_pointer);
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  poVar3 = std::operator<<(poVar3,"dt: 0x");
  _Var2 = std::setw(2);
  poVar3 = std::operator<<(poVar3,_Var2);
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,(uint)this->_delay_timer);
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  poVar3 = std::operator<<(poVar3,"st: 0x");
  _Var2 = std::setw(2);
  poVar3 = std::operator<<(poVar3,_Var2);
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,(uint)this->_sound_timer);
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  poVar3 = std::operator<<((ostream *)&std::cout,"-------------------------------");
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void CPU::dump() {
        std::cout << "-------- CPU Registers --------" << std::endl;
        for (int i=0; i<4; i++) {
            std::cout << std::hex << std::setfill('0') <<
                std::setw(1) << i + 0  << ": 0x" << std::setw(2) << int(_registers[i+0])  << " " <<
                std::setw(1) << i + 4  << ": 0x" << std::setw(2) << int(_registers[i+4])  << " " <<
                std::setw(1) << i + 8  << ": 0x" << std::setw(2) << int(_registers[i+8])  << " " <<
                std::setw(1) << i + 12 << ": 0x" << std::setw(2) << int(_registers[i+12]) << " " <<
                std::endl;
        }
        std::cout << std::endl;

        std::cout << "pc: 0x" << std::setw(3) << int(_program_counter) << std::endl
                  << "ix: 0x" << std::setw(3) << int(_index_register) << std::endl
                  << "sp: 0x" << std::setw(3) << int(_stack_pointer) << std::endl
                  << "dt: 0x" << std::setw(2) << int(_delay_timer) << std::endl
                  << "st: 0x" << std::setw(2) << int(_sound_timer) << std::endl;

        std::cout << "-------------------------------" << std::endl;
        std::cout << std::endl;
    }